

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

void __thiscall
iutest::detail::ExpressionLHS<bool>::AppendMessage<bool>(ExpressionLHS<bool> *this,bool *value)

{
  string local_1d0;
  undefined1 local_1a0 [8];
  Message msg;
  bool *value_local;
  ExpressionLHS<bool> *this_local;
  
  msg.m_stream.super_iu_stringstream._384_8_ = value;
  iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_1a0);
  iuStreamMessage::operator<<
            ((iuStreamMessage *)local_1a0,(bool *)msg.m_stream.super_iu_stringstream._384_8_);
  iuStreamMessage::GetString_abi_cxx11_(&local_1d0,(iuStreamMessage *)local_1a0);
  std::__cxx11::string::operator+=((string *)&this->m_message,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  iuStreamMessage::~iuStreamMessage((iuStreamMessage *)local_1a0);
  return;
}

Assistant:

void AppendMessage(const U& value)
    {
        Message msg;
        msg << value;
        m_message += msg.GetString();
    }